

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_copy(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_vm *pVm;
  jx9_io_stream *pStream;
  void *pvVar1;
  jx9_io_stream *pStream_00;
  void *pvVar2;
  jx9_int64 jVar3;
  char *pcVar4;
  int iBool;
  jx9_value *pjVar5;
  char *zFile;
  int nLen;
  jx9_vm *local_2040;
  char zBuf [8192];
  
  if (((nArg < 2) || (((*apArg)->iFlags & 1) == 0)) || ((apArg[1]->iFlags & 1) == 0)) {
    pcVar4 = "Expecting a source and a destination path";
LAB_001360b9:
    jx9_context_throw_error(pCtx,2,pcVar4);
  }
  else {
    zFile = jx9_value_to_string(*apArg,&nLen);
    pVm = pCtx->pVm;
    pStream = jx9VmGetStreamDevice(pVm,&zFile,nLen);
    pcVar4 = zFile;
    if (pStream == (jx9_io_stream *)0x0) {
      pcVar4 = "No such stream device, JX9 is returning FALSE";
      goto LAB_001360b9;
    }
    if (nArg == 2) {
      pjVar5 = (jx9_value *)0x0;
    }
    else {
      pjVar5 = apArg[2];
    }
    pvVar1 = jx9StreamOpenHandle(pVm,pStream,zFile,1,0,pjVar5,0,(int *)0x0);
    if (pvVar1 != (void *)0x0) {
      zFile = jx9_value_to_string(apArg[1],&nLen);
      local_2040 = pCtx->pVm;
      pStream_00 = jx9VmGetStreamDevice(local_2040,&zFile,nLen);
      pcVar4 = zFile;
      if (pStream_00 == (jx9_io_stream *)0x0) {
        jx9_context_throw_error(pCtx,2,"No such stream device, JX9 is returning FALSE");
LAB_0013628c:
        jx9_result_bool(pCtx,0);
        if (pStream->xClose == (_func_void_void_ptr *)0x0) {
          return 0;
        }
        (*pStream->xClose)(pvVar1);
        return 0;
      }
      if (pStream_00->xWrite == (_func_jx9_int64_void_ptr_void_ptr_jx9_int64 *)0x0) {
        jx9_context_throw_error_format
                  (pCtx,2,
                   "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
                   ,(pCtx->pFunc->sName).zString,pStream->zName);
        goto LAB_0013628c;
      }
      if (nArg == 2) {
        pjVar5 = (jx9_value *)0x0;
      }
      else {
        pjVar5 = apArg[2];
      }
      pvVar2 = jx9StreamOpenHandle(local_2040,pStream_00,zFile,0x1c,0,pjVar5,0,(int *)0x0);
      if (pvVar2 == (void *)0x0) {
        jx9_context_throw_error_format(pCtx,1,"IO error while opening destination: \'%s\'",pcVar4);
        goto LAB_0013628c;
      }
      do {
        jVar3 = (*pStream->xRead)(pvVar1,zBuf,0x2000);
        if (jVar3 < 1) break;
        jVar3 = (*pStream_00->xWrite)(pvVar2,zBuf,jVar3);
      } while (0 < jVar3);
      if (pStream->xClose != (_func_void_void_ptr *)0x0) {
        (*pStream->xClose)(pvVar1);
      }
      if (pStream_00->xClose != (_func_void_void_ptr *)0x0) {
        (*pStream_00->xClose)(pvVar2);
      }
      iBool = 1;
      goto LAB_001360c9;
    }
    jx9_context_throw_error_format(pCtx,1,"IO error while opening source: \'%s\'",pcVar4);
  }
  iBool = 0;
LAB_001360c9:
  jx9_result_bool(pCtx,iBool);
  return 0;
}

Assistant:

static int jx9Builtin_copy(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pSin, *pSout;	
	const char *zFile;
	char zBuf[8192];
	void *pIn, *pOut;
	jx9_int64 n;
	int nLen;
	if( nArg < 2 || !jx9_value_is_string(apArg[0]) || !jx9_value_is_string(apArg[1])){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a source and a destination path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the source name */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pSin = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pSin == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Try to open the source file in a read-only mode */
	pIn = jx9StreamOpenHandle(pCtx->pVm, pSin, zFile, JX9_IO_OPEN_RDONLY, FALSE, nArg > 2 ? apArg[2] : 0, FALSE, 0);
	if( pIn == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening source: '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the destination name */
	zFile = jx9_value_to_string(apArg[1], &nLen);
	/* Point to the target IO stream device */
	pSout = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pSout == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		jx9StreamCloseHandle(pSin, pIn);
		return JX9_OK;
	}
	if( pSout->xWrite == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pSin->zName
			);
		jx9_result_bool(pCtx, 0);
		jx9StreamCloseHandle(pSin, pIn);
		return JX9_OK;
	}
	/* Try to open the destination file in a read-write mode */
	pOut = jx9StreamOpenHandle(pCtx->pVm, pSout, zFile, 
		JX9_IO_OPEN_CREATE|JX9_IO_OPEN_TRUNC|JX9_IO_OPEN_RDWR, FALSE, nArg > 2 ? apArg[2] : 0, FALSE, 0);
	if( pOut == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening destination: '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		jx9StreamCloseHandle(pSin, pIn);
		return JX9_OK;
	}
	/* Perform the requested operation */
	for(;;){
		/* Read from source */
		n = pSin->xRead(pIn, zBuf, sizeof(zBuf));
		if( n < 1 ){
			/* EOF or IO error, break immediately */
			break;
		}
		/* Write to dest */
		n = pSout->xWrite(pOut, zBuf, n);
		if( n < 1 ){
			/* IO error, break immediately */
			break;
		}
	}
	/* Close the streams */
	jx9StreamCloseHandle(pSin, pIn);
	jx9StreamCloseHandle(pSout, pOut);
	/* Return TRUE */
	jx9_result_bool(pCtx, 1);
	return JX9_OK;
}